

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void * __thiscall
Lib::
SkipList<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs,Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>::LDComparator>
::
insertPositionRaw<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
          (SkipList<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs,Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>::LDComparator>
           *this,Rhs *key)

{
  Node *ld2;
  Node *pNVar1;
  bool bVar2;
  Comparison CVar3;
  Node *pNVar4;
  uint h;
  uint uVar5;
  ulong uVar6;
  Node *pNVar7;
  
  h = 0xffffffff;
  do {
    bVar2 = Random::getBit();
    h = h + 1;
  } while (bVar2);
  uVar5 = *(uint *)(this + 8);
  if (uVar5 <= h) {
    if (uVar5 < 0x20) {
      *(uint *)(this + 8) = uVar5 + 1;
      h = uVar5;
    }
    else {
      h = uVar5 - 1;
    }
  }
  pNVar4 = SkipList<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::LDComparator>
           ::allocate(h);
  uVar6 = (ulong)*(uint *)(this + 8);
  pNVar7 = *(Node **)this;
LAB_0031b854:
  do {
    uVar5 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar5;
    pNVar1 = pNVar7;
    do {
      pNVar7 = pNVar1;
      ld2 = pNVar7->nodes[uVar6];
      if (ld2 == (Node *)0x0) {
        if (h < uVar5) goto LAB_0031b854;
        pNVar7->nodes[uVar6] = pNVar4;
        pNVar4->nodes[uVar6] = (Node *)0x0;
        goto LAB_0031b89e;
      }
      CVar3 = Indexing::
              SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
              ::LDComparator::
              compare<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
                        (key,&ld2->value);
      pNVar1 = ld2;
    } while (((uint)CVar3 < 2) || (pNVar1 = pNVar7, CVar3 != LESS));
    if (uVar5 <= h) {
      pNVar4->nodes[uVar6] = ld2;
      pNVar7->nodes[uVar6] = pNVar4;
LAB_0031b89e:
      if (uVar6 == 0) {
        return pNVar4;
      }
    }
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }